

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_usdf.cpp
# Opt level: O2

bool __thiscall USDFParser::ParsePage(USDFParser *this)

{
  bool bVar1;
  uint uVar2;
  FTextureID FVar3;
  int iVar4;
  PClassActor *pPVar5;
  char *pcVar6;
  FString *this_00;
  bool block;
  FStrifeDialogueNode *node;
  FString Goodbye;
  FString Dialogue;
  FString SpeakerName;
  FString soundname;
  FName key;
  FStrifeDialogueReply **replyptr;
  
  node = (FStrifeDialogueNode *)operator_new(0x50);
  node->Goodbye = (char *)0x0;
  node->Children = (FStrifeDialogueReply *)0x0;
  node->SpeakerVoice = 0;
  node->Backdrop = 0;
  node->Dialogue = (char *)0x0;
  node->SpeakerType = (PClassActor *)0x0;
  node->SpeakerName = (char *)0x0;
  (node->ItemCheck).Most = 0;
  (node->ItemCheck).Count = 0;
  node->ThisNodeNum = 0;
  node->ItemCheckNode = 0;
  node->DropType = (PClassActor *)0x0;
  (node->ItemCheck).Array = (FStrifeDialogueItemCheck *)0x0;
  uVar2 = TArray<FStrifeDialogueNode_*,_FStrifeDialogueNode_*>::Push(&StrifeDialogues,&node);
  node->ThisNodeNum = uVar2;
  node->ItemCheckNode = -1;
  FString::NullString.RefCount = FString::NullString.RefCount + 3;
  SpeakerName.Chars = FString::NullString.Nothing;
  Dialogue.Chars = FString::NullString.Nothing;
  Goodbye.Chars = FString::NullString.Nothing;
switchD_00460bf7_caseD_1ed:
  bVar1 = FScanner::CheckToken((FScanner *)this,0x7d);
  if (bVar1) {
    pcVar6 = ncopystring(SpeakerName.Chars);
    node->SpeakerName = pcVar6;
    pcVar6 = ncopystring(Dialogue.Chars);
    node->Dialogue = pcVar6;
    pcVar6 = ncopystring(Goodbye.Chars);
    node->Goodbye = pcVar6;
    FString::~FString(&Goodbye);
    FString::~FString(&Dialogue);
    FString::~FString(&SpeakerName);
    return bVar1;
  }
  UDMFParserBase::ParseKey((UDMFParserBase *)&key,SUB81(this,0),(bool *)0x1);
  switch(key.Index) {
  case 0x1ea:
    pcVar6 = UDMFParserBase::CheckString
                       (&this->super_UDMFParserBase,FName::NameData.NameArray[0x1ea].Text);
    this_00 = &SpeakerName;
    break;
  case 0x1eb:
    pcVar6 = UDMFParserBase::CheckString
                       (&this->super_UDMFParserBase,FName::NameData.NameArray[0x1eb].Text);
    FVar3 = FTextureManager::CheckForTexture(&TexMan,pcVar6,8,1);
    (node->Backdrop).texnum = FVar3.texnum;
    goto switchD_00460bf7_caseD_1ed;
  case 0x1ec:
    pcVar6 = UDMFParserBase::CheckString
                       (&this->super_UDMFParserBase,FName::NameData.NameArray[0x1ec].Text);
    this_00 = &Dialogue;
    break;
  case 0x1ed:
  case 0x1ee:
    goto switchD_00460bf7_caseD_1ed;
  case 0x1ef:
    iVar4 = UDMFParserBase::CheckInt
                      (&this->super_UDMFParserBase,FName::NameData.NameArray[0x1ef].Text);
    node->ItemCheckNode = iVar4;
    goto switchD_00460bf7_caseD_1ed;
  case 0x1f0:
    if ((this->super_UDMFParserBase).namespace_bits != 1) goto switchD_00460bf7_caseD_1ed;
    pcVar6 = UDMFParserBase::CheckString
                       (&this->super_UDMFParserBase,FName::NameData.NameArray[0x1f0].Text);
    this_00 = &Goodbye;
    break;
  default:
    if (key.Index == 0x28) {
      pcVar6 = UDMFParserBase::CheckString
                         (&this->super_UDMFParserBase,FName::NameData.NameArray[0x28].Text);
      if (*pcVar6 != '\0') {
        FString::FString(&soundname,"svox/");
        FString::operator+=(&soundname,pcVar6);
        iVar4 = S_FindSound(soundname.Chars);
        (node->SpeakerVoice).ID = iVar4;
        if ((iVar4 == 0) && ((this->super_UDMFParserBase).namespace_bits == 1)) {
          iVar4 = S_FindSound(pcVar6);
          (node->SpeakerVoice).ID = iVar4;
        }
        FString::~FString(&soundname);
      }
    }
    else if (key.Index == 0xb4) {
      pPVar5 = CheckActorType(this,FName::NameData.NameArray[0xb4].Text);
      node->DropType = pPVar5;
    }
    goto switchD_00460bf7_caseD_1ed;
  }
  FString::operator=(this_00,pcVar6);
  goto switchD_00460bf7_caseD_1ed;
}

Assistant:

bool ParsePage()
	{
		FStrifeDialogueNode *node = new FStrifeDialogueNode;
		FStrifeDialogueReply **replyptr = &node->Children;
		memset(node, 0, sizeof(*node));
		//node->ItemCheckCount[0] = node->ItemCheckCount[1] = node->ItemCheckCount[2] = -1;

		node->ThisNodeNum = StrifeDialogues.Push(node);
		node->ItemCheckNode = -1;

		FString SpeakerName;
		FString Dialogue;
		FString Goodbye;

		while (!sc.CheckToken('}'))
		{
			bool block = false;
			FName key = ParseKey(true, &block);
			if (!block)
			{
				switch(key)
				{
				case NAME_Name:
					SpeakerName = CheckString(key);
					break;

				case NAME_Panel:
					node->Backdrop = TexMan.CheckForTexture (CheckString(key), FTexture::TEX_MiscPatch);
					break;

				case NAME_Voice:
					{
						const char * name = CheckString(key);
						if (name[0] != 0)
						{
							FString soundname = "svox/";
							soundname += name;
							node->SpeakerVoice = FSoundID(S_FindSound(soundname));
							if (node->SpeakerVoice == 0 && namespace_bits == Zd)
							{
								node->SpeakerVoice = FSoundID(S_FindSound(name));
							}
						}
					}
					break;

				case NAME_Dialog:
					Dialogue = CheckString(key);
					break;

				case NAME_Drop:
					node->DropType = CheckActorType(key);
					break;

				case NAME_Link:
					node->ItemCheckNode = CheckInt(key);
					break;

				case NAME_Goodbye:
					// Custom goodbyes are exclusive to namespace ZDoom. [FishyClockwork]
					if (namespace_bits == Zd)
					{
						Goodbye = CheckString(key);
					}
					break;
				}
			}
			else
			{
				switch(key)
				{
				case NAME_Ifitem:
					if (!ParseIfItem(node)) return false;
					break;

				case NAME_Choice:
					if (!ParseChoice(replyptr)) return false;
					break;

				default:
					sc.UnGet();
					Skip();
				}
			}
		}
		node->SpeakerName = ncopystring(SpeakerName);
		node->Dialogue = ncopystring(Dialogue);
		node->Goodbye = ncopystring(Goodbye);
		return true;
	}